

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

PolicyStatus __thiscall cmMakefile::GetPolicyStatusInternal(cmMakefile *this,PolicyID id)

{
  bool bVar1;
  PolicyStatus PVar2;
  pointer pPVar3;
  cmLocalGenerator *pcVar4;
  cmMakefile *this_00;
  cmMakefile *parent;
  undefined1 local_28 [8];
  const_reverse_iterator psi;
  PolicyID id_local;
  cmMakefile *this_local;
  
  psi.current._M_current._4_4_ = id;
  std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::rbegin
            ((vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_> *)
             local_28);
  while( true ) {
    std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>::rend
              ((vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>
                *)&parent);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                             *)local_28,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                             *)&parent);
    if (!bVar1) {
      pcVar4 = cmLocalGenerator::GetParent(this->LocalGenerator);
      if (pcVar4 == (cmLocalGenerator *)0x0) {
        this_local._4_4_ = cmPolicies::GetPolicyStatus(psi.current._M_current._4_4_);
      }
      else {
        pcVar4 = cmLocalGenerator::GetParent(this->LocalGenerator);
        this_00 = cmLocalGenerator::GetMakefile(pcVar4);
        this_local._4_4_ = GetPolicyStatusInternal(this_00,psi.current._M_current._4_4_);
      }
      return this_local._4_4_;
    }
    pPVar3 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
             ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                           *)local_28);
    bVar1 = cmPolicies::PolicyMap::IsDefined(&pPVar3->super_PolicyMap,psi.current._M_current._4_4_);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                  *)local_28);
  }
  pPVar3 = std::
           reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
           ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_cmMakefile::PolicyStackEntry_*,_std::vector<cmMakefile::PolicyStackEntry,_std::allocator<cmMakefile::PolicyStackEntry>_>_>_>
                         *)local_28);
  PVar2 = cmPolicies::PolicyMap::Get(&pPVar3->super_PolicyMap,psi.current._M_current._4_4_);
  return PVar2;
}

Assistant:

cmPolicies::PolicyStatus
cmMakefile::GetPolicyStatusInternal(cmPolicies::PolicyID id) const
{
  // Is the policy set in our stack?
  for(PolicyStackType::const_reverse_iterator psi = this->PolicyStack.rbegin();
      psi != this->PolicyStack.rend(); ++psi)
    {
    if(psi->IsDefined(id))
      {
      return psi->Get(id);
      }
    }

  // If we have a parent directory, recurse up to it.
  if(this->LocalGenerator->GetParent())
    {
    cmMakefile* parent = this->LocalGenerator->GetParent()->GetMakefile();
    return parent->GetPolicyStatusInternal(id);
    }

  // The policy is not set.  Use the default for this CMake version.
  return cmPolicies::GetPolicyStatus(id);
}